

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caxpy.c
# Opt level: O2

void caxpy_(integer *n,singlecomplex *ca,singlecomplex *cx,integer *incx,singlecomplex *cy,
           integer *incy)

{
  int iVar1;
  double dVar2;
  singlecomplex sVar3;
  singlecomplex sVar4;
  ulong uVar5;
  ulong uVar6;
  singlecomplex *psVar7;
  int iVar8;
  long lVar9;
  singlecomplex *psVar10;
  int iVar11;
  bool bVar12;
  uint uVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  
  if (0 < *n) {
    fVar16 = ca->r;
    dVar2 = r_imag(ca);
    fVar15 = (float)dVar2;
    uVar13 = -(uint)(-fVar16 <= fVar16);
    uVar14 = -(uint)(-fVar15 <= fVar15);
    fVar16 = (float)(~uVar14 & (uint)-fVar15 | (uint)fVar15 & uVar14) +
             (float)(~uVar13 & (uint)-fVar16 | (uint)fVar16 & uVar13);
    if ((fVar16 != 0.0) || (NAN(fVar16))) {
      iVar1 = *incx;
      if ((long)iVar1 == 1) {
        iVar8 = *incy;
        uVar13 = *n;
        if (iVar8 == 1) {
          uVar5 = 0;
          uVar6 = (ulong)uVar13;
          if ((int)uVar13 < 1) {
            uVar6 = uVar5;
          }
          for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
            fVar16 = cx[uVar5].r;
            fVar15 = cx[uVar5].i;
            sVar3.i = cy[uVar5].i + ca->r * fVar15 + fVar16 * ca->i;
            sVar3.r = cy[uVar5].r + ca->r * fVar16 + fVar15 * -ca->i;
            cy[uVar5] = sVar3;
          }
          return;
        }
        lVar9 = 1;
      }
      else {
        uVar13 = *n;
        iVar8 = (1 - uVar13) * iVar1 + 1;
        if (-1 < iVar1) {
          iVar8 = 1;
        }
        lVar9 = (long)iVar8;
        iVar8 = *incy;
      }
      iVar11 = (1 - uVar13) * iVar8 + 1;
      if (-1 < iVar8) {
        iVar11 = 1;
      }
      uVar14 = 0;
      if (0 < (int)uVar13) {
        uVar14 = uVar13;
      }
      psVar7 = cy + (long)iVar11 + -1;
      psVar10 = cx + lVar9 + -1;
      while (bVar12 = uVar14 != 0, uVar14 = uVar14 - 1, bVar12) {
        fVar16 = (*psVar10).r;
        fVar15 = (*psVar10).i;
        sVar4.i = (*psVar7).i + ca->r * fVar15 + fVar16 * ca->i;
        sVar4.r = (*psVar7).r + ca->r * fVar16 + fVar15 * -ca->i;
        *psVar7 = sVar4;
        psVar7 = psVar7 + iVar8;
        psVar10 = psVar10 + iVar1;
      }
    }
  }
  return;
}

Assistant:

void caxpy_(integer *n, singlecomplex *ca, singlecomplex *cx, integer *
	incx, singlecomplex *cy, integer *incy)
{


    /* System generated locals */

    real r__1, r__2;
    singlecomplex q__1, q__2;

    /* Builtin functions */
    double r_imag(singlecomplex *);

    /* Local variables */
    integer i, ix, iy;


/*     constant times a vector plus a vector.   
       jack dongarra, linpack, 3/11/78.   
       modified 12/3/93, array(1) declarations changed to array(*)   


    
   Parameter adjustments   
       Function Body */
#define CY(I) cy[(I)-1]
#define CX(I) cx[(I)-1]


    if (*n <= 0) {
	return;
    }
    if ((r__1 = ca->r, dabs(r__1)) + (r__2 = r_imag(ca), dabs(r__2)) == 0.f) {
	return;
    }
    if (*incx == 1 && *incy == 1) {
	goto L20;
    }

/*        code for unequal increments or equal increments   
            not equal to 1 */

    ix = 1;
    iy = 1;
    if (*incx < 0) {
	ix = (-(*n) + 1) * *incx + 1;
    }
    if (*incy < 0) {
	iy = (-(*n) + 1) * *incy + 1;
    }
    for (i = 1; i <= *n; ++i) {
	q__2.r = ca->r * CX(ix).r - ca->i * CX(ix).i, q__2.i = ca->r * CX(
		ix).i + ca->i * CX(ix).r;
	q__1.r = CY(iy).r + q__2.r, q__1.i = CY(iy).i + q__2.i;
	CY(iy).r = q__1.r, CY(iy).i = q__1.i;
	ix += *incx;
	iy += *incy;
/* L10: */
    }
    return;

/*        code for both increments equal to 1 */

L20:
    for (i = 1; i <= *n; ++i) {
	q__2.r = ca->r * CX(i).r - ca->i * CX(i).i, q__2.i = ca->r * CX(
		i).i + ca->i * CX(i).r;
	q__1.r = CY(i).r + q__2.r, q__1.i = CY(i).i + q__2.i;
	CY(i).r = q__1.r, CY(i).i = q__1.i;
/* L30: */
    }
    return;
}